

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
Logger::Logger(Logger *this,string *logDir,string *logModuleName,LogLevel logLevel,
              bool outputToTerminal)

{
  _Rb_tree_header *p_Var1;
  
  (this->logDir)._M_dataplus._M_p = (pointer)&(this->logDir).field_2;
  (this->logDir)._M_string_length = 0;
  (this->logDir).field_2._M_local_buf[0] = '\0';
  (this->logModuleName)._M_dataplus._M_p = (pointer)&(this->logModuleName).field_2;
  (this->logModuleName)._M_string_length = 0;
  (this->logModuleName).field_2._M_local_buf[0] = '\0';
  (this->logFileName)._M_dataplus._M_p = (pointer)&(this->logFileName).field_2;
  (this->logFileName)._M_string_length = 0;
  (this->logFileName).field_2._M_local_buf[0] = '\0';
  (this->logCreateDate)._M_dataplus._M_p = (pointer)&(this->logCreateDate).field_2;
  (this->logCreateDate)._M_string_length = 0;
  (this->logCreateDate).field_2._M_local_buf[0] = '\0';
  (this->logConfigFile)._M_dataplus._M_p = (pointer)&(this->logConfigFile).field_2;
  (this->logConfigFile)._M_string_length = 0;
  (this->logConfigFile).field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream(&this->logfp,(char *)0x0,_S_out);
  (this->logQueueMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->logQueueMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->logQueueMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->logQueueMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->configMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->logQueueMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->configMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->configMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->configMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->configMtx).super___mutex_base._M_mutex + 8) = 0;
  std::queue<LogMessage,std::deque<LogMessage,std::allocator<LogMessage>>>::
  queue<std::deque<LogMessage,std::allocator<LogMessage>>,void>(&this->logQueue);
  (this->logThread)._M_id._M_thread = 0;
  (this->timerThread)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&this->cv);
  p_Var1 = &(this->log_map)._M_t._M_impl.super__Rb_tree_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->log_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)&this->logDir);
  std::__cxx11::string::_M_assign((string *)&this->logModuleName);
  this->logLevel = logLevel;
  this->outputToTerminal = outputToTerminal;
  std::__cxx11::string::assign((char *)&this->logConfigFile);
  return;
}

Assistant:

Logger(std::string logDir, std::string logModuleName, LogLevel logLevel, bool outputToTerminal) {
        this->logDir = logDir;
        this->logModuleName = logModuleName;
        this->logLevel = logLevel;
        this->outputToTerminal = outputToTerminal;
        logConfigFile = "./logger.conf";   // 日志配置文件名称
    }